

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackDebGenerator::PackageComponentsAllInOne(cmCPackDebGenerator *this,string *compInstDirName)

{
  pointer pcVar1;
  cmCPackLog *pcVar2;
  size_t sVar3;
  bool bVar4;
  string *psVar5;
  size_t sVar6;
  uint uVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string outputFileName;
  string localToplevel;
  string initialTopLevel;
  string packageFileName;
  ostringstream cmCPackLog_msg;
  string component_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  size_type local_238;
  pointer local_230;
  long *local_228 [2];
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->super_cmCPackGenerator).packageFileNames,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_TEMPORARY_DIRECTORY","");
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1c8);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_208 = local_1f8;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar1,pcVar1 + psVar5->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,
                    CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,local_1b8[0]._M_local_buf[0])
                    + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,
             "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
             ,0x5b);
  std::ios::widen((char)(ostream *)local_1c8 + (char)*(undefined8 *)(local_1c8._0_8_ + -0x18));
  std::ostream::put((char)local_1c8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  sVar3 = local_248._M_len;
  sVar6 = strlen((char *)local_248._M_len);
  cmCPackLog::Log(pcVar2,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x26e,(char *)sVar3,sVar6);
  if ((size_type *)local_248._M_len != &local_238) {
    operator_delete((void *)local_248._M_len,local_238 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,local_208,local_200 + (long)local_208);
  cmsys::SystemTools::GetParentDirectory(&local_1e8,&(this->super_cmCPackGenerator).toplevel);
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CPACK_PACKAGE_FILE_NAME","");
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1c8);
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,pcVar1,pcVar1 + psVar5->_M_string_length);
  std::__cxx11::string::append((char *)&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,
                    CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,local_1b8[0]._M_local_buf[0])
                    + 1);
  }
  if (compInstDirName->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   "/",compInstDirName);
    std::__cxx11::string::_M_append((char *)local_228,local_1c8._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != local_1b8) {
      operator_delete((void *)local_1c8._0_8_,
                      CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,local_1b8[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_TEMPORARY_DIRECTORY","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1c8,(string *)local_228)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,
                    CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,local_1b8[0]._M_local_buf[0])
                    + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,"/",
                 &local_268);
  std::__cxx11::string::_M_append((char *)&local_1e8,local_1c8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,
                    CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,local_1b8[0]._M_local_buf[0])
                    + 1);
  }
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CPACK_OUTPUT_FILE_NAME","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1c8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,
                    CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,local_1b8[0]._M_local_buf[0])
                    + 1);
  }
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1c8,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,
                    CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,local_1b8[0]._M_local_buf[0])
                    + 1);
  }
  if (compInstDirName->_M_string_length != 0) {
    local_1c8._0_8_ = (pointer)0x1;
    local_1b8[0]._M_local_buf[0] = '/';
    local_230 = (compInstDirName->_M_dataplus)._M_p;
    local_248._M_len = 1;
    views._M_len = 2;
    views._M_array = &local_248;
    local_248._M_str = (char *)local_1b8;
    local_238 = compInstDirName->_M_string_length;
    local_1c8._8_8_ = local_1b8;
    cmCatViews_abi_cxx11_(&local_50,views);
    local_1c8._0_8_ = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH","");
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1c8,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != local_1b8) {
      operator_delete((void *)local_1c8._0_8_,
                      CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,local_1b8[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackDeb.cmake");
  if (bVar4) {
    bVar4 = createDebPackages(this);
    uVar7 = (uint)bVar4;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Error while execution CPackDeb.cmake",0x24);
    std::ios::widen((char)(ostream *)local_1c8 + (char)*(undefined8 *)(local_1c8._0_8_ + -0x18));
    std::ostream::put((char)local_1c8);
    std::ostream::flush();
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    sVar3 = local_248._M_len;
    sVar6 = strlen((char *)local_248._M_len);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x28c,(char *)sVar3,sVar6);
    if ((size_type *)local_248._M_len != &local_238) {
      operator_delete((void *)local_248._M_len,local_238 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    uVar7 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  return uVar7;
}

Assistant:

int cmCPackDebGenerator::PackageComponentsAllInOne(
  const std::string& compInstDirName)
{
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  this->packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                  << std::endl);

  // The ALL GROUPS in ONE package case
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(
    cmSystemTools::GetParentDirectory(this->toplevel));
  std::string outputFileName(*this->GetOption("CPACK_PACKAGE_FILE_NAME") +
                             this->GetOutputExtension());
  // all GROUP in one vs all COMPONENT in one
  // if must be here otherwise non component paths have a trailing / while
  // components don't
  if (!compInstDirName.empty()) {
    localToplevel += "/" + compInstDirName;
  }

  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel);
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName);
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME", packageFileName);

  if (!compInstDirName.empty()) {
    // Tell CPackDeb.cmake the path where the component is.
    std::string component_path = cmStrCat('/', compInstDirName);
    this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH", component_path);
  }
  if (!this->ReadListFile("Internal/CPack/CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackDeb.cmake" << std::endl);
    return 0;
  }

  return this->createDebPackages();
}